

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O2

int curl_strnequal(char *first,char *second,size_t max)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  
  if (second == (char *)0x0 || first == (char *)0x0) {
    bVar3 = max != 0 && (first == (char *)0x0 && second == (char *)0x0);
  }
  else {
    for (sVar1 = 0;
        ((uVar2 = (ulong)(byte)first[sVar1], uVar2 != 0 && ((ulong)(byte)second[sVar1] != 0)) &&
        (max != sVar1)); sVar1 = sVar1 + 1) {
      if (""[uVar2] != ""[(byte)second[sVar1]]) {
        bVar3 = false;
        goto LAB_00154693;
      }
    }
    bVar3 = true;
    if (max != sVar1) {
      bVar3 = ""[uVar2] == ""[(byte)second[sVar1]];
    }
  }
LAB_00154693:
  return (int)bVar3;
}

Assistant:

int curl_strnequal(const char *first, const char *second, size_t max)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return ncasecompare(first, second, max);

  /* if both pointers are NULL then treat them as equal if max is non-zero */
  return (NULL == first && NULL == second && max);
}